

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

LOs __thiscall Omega_h::invert_funnel(Omega_h *this,LOs *ab2a,LO na)

{
  void *extraout_RDX;
  LOs LVar1;
  LO local_114;
  Write<int> local_d8;
  Write<int> local_c8;
  int local_b4;
  undefined1 local_b0 [4];
  LO a_end;
  type f;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  Write<int> a2ab;
  LO nab;
  LO na_local;
  LOs *ab2a_local;
  ulong local_10;
  
  if (((ulong)(ab2a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((ab2a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(ab2a->write_).shared_alloc_.alloc >> 3;
  }
  a2ab.shared_alloc_.direct_ptr._0_4_ = (int)(local_10 >> 2);
  a2ab.shared_alloc_.direct_ptr._4_4_ = na;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  Write<int>::Write((Write<int> *)local_58,na + 1,-1,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  Write<int>::set((Write<int> *)local_58,0,0);
  Read<int>::Read((Read<int> *)local_b0,ab2a);
  Write<int>::Write((Write<int> *)&f.ab2a.write_.shared_alloc_.direct_ptr,(Write<int> *)local_58);
  local_114 = (int)a2ab.shared_alloc_.direct_ptr + -1;
  if (local_114 < 1) {
    local_114 = 0;
  }
  parallel_for<Omega_h::invert_funnel(Omega_h::Read<int>,int)::__0>
            (local_114,(type *)local_b0,"invert_funnel");
  if ((int)a2ab.shared_alloc_.direct_ptr != 0) {
    local_b4 = Read<int>::get(ab2a,(int)a2ab.shared_alloc_.direct_ptr + -1);
    Write<int>::set((Write<int> *)local_58,local_b4 + 1,(int)a2ab.shared_alloc_.direct_ptr);
  }
  Write<int>::Write(&local_c8,(Write<int> *)local_58);
  fill_right(&local_c8);
  Write<int>::~Write(&local_c8);
  Write<int>::Write(&local_d8,(Write<int> *)local_58);
  Read<int>::Read((Read<int> *)this,&local_d8);
  Write<int>::~Write(&local_d8);
  invert_funnel(Omega_h::Read<int>,int)::$_0::~__0((__0 *)local_b0);
  Write<int>::~Write((Write<int> *)local_58);
  LVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar1.write_.shared_alloc_;
}

Assistant:

LOs invert_funnel(LOs ab2a, LO na) {
  LO nab = ab2a.size();
  Write<LO> a2ab(na + 1, -1);
  a2ab.set(0, 0);
  auto f = OMEGA_H_LAMBDA(LO ab) {
    LO a_end = ab2a[ab];
    LO a_start = ab2a[ab + 1];
    if (a_end != a_start) {
      a2ab[a_end + 1] = ab + 1;
    }
  };
  parallel_for(max2(0, nab - 1), f, "invert_funnel");
  if (nab) {
    LO a_end = ab2a.get(nab - 1);
    a2ab.set(a_end + 1, nab);
  }
  fill_right(a2ab);
  return a2ab;
}